

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.hpp
# Opt level: O2

void progress_bar(int current_frame_index,int total_frames)

{
  ostream *poVar1;
  string clearln;
  string mvleft;
  allocator<char> local_51;
  allocator<char> local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"\x1b[1000D",local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"\x1b[2K",&local_51);
  poVar1 = std::operator<<((ostream *)&std::cout,local_30);
  std::operator<<(poVar1,(string *)local_50);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)color::yellow_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," Processing: ");
  poVar1 = std::operator<<(poVar1,(string *)color::green_abi_cxx11_);
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,((current_frame_index + 1) / total_frames) * 100);
  poVar1 = std::operator<<(poVar1,"%");
  std::operator<<(poVar1,(string *)color::reset_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void progress_bar(int current_frame_index, int total_frames)
{
    std::string const mvleft = "\033[1000D";
    std::string const clearln = "\033[2K";
    std::cout << mvleft << clearln;
    std::cout << color::yellow << " Processing: " << color::green << ((current_frame_index + 1) / total_frames) * 100 << "%" << color::reset;
}